

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

void __thiscall
minja::BinaryOpExpr::BinaryOpExpr
          (BinaryOpExpr *this,Location *loc,shared_ptr<minja::Expression> *l,
          shared_ptr<minja::Expression> *r,Op o)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR___cxa_pure_virtual_002619f0;
  (this->super_Expression).location.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (loc->source).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (loc->source).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->super_Expression).location.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->super_Expression).location.pos = loc->pos;
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_do_evaluate_00261f70;
  (this->left).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (l->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (l->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (l->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->left).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->left).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (l->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->right).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (r->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (r->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (r->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->right).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (r->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->op = o;
  return;
}

Assistant:

Expression(const Location & location) : location(location) {}